

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
          (BumpAllocator *this,span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *pSVar1;
  __extent_storage<18446744073709551615UL> in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)
           allocate(in_RDI,in_RSI._M_extent_value,in_stack_ffffffffffffffe8);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = *(pointer *)(in_RSI._M_extent_value + 8);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::SeparatedSyntaxList
            (*(SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> **)
              in_RSI._M_extent_value,elements);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }